

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::_park(NonblockingNotifierV2 *this,Waiter *w)

{
  long in_RSI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffe0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  while (*(int *)(in_RSI + 0x68) != 2) {
    *(undefined4 *)(in_RSI + 0x68) = 1;
    std::condition_variable::wait((unique_lock *)(in_RSI + 0x38));
  }
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void _park(Waiter* w) {
#if __cplusplus >= TF_CPP20
    unsigned target = Waiter::kNotSignaled;
    if(w->state.compare_exchange_strong(target, Waiter::kWaiting,
                                        std::memory_order_relaxed,
                                        std::memory_order_relaxed)) {
      w->state.wait(Waiter::kWaiting, std::memory_order_relaxed);
    }
#else
    std::unique_lock<std::mutex> lock(w->mu);
    while (w->state != Waiter::kSignaled) {
      w->state = Waiter::kWaiting;
      w->cv.wait(lock);
    }
#endif
  }